

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,char*>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          char *params)

{
  string *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_00;
  undefined1 local_80 [56];
  string local_48 [32];
  
  param_00 = param;
  ::std::__cxx11::string::string((string *)local_80,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_80 + 0x20),(ExceptionFormatValue *)local_80,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_80 + 0x20));
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string((string *)local_80);
  ConstructMessageRecursive<char*>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,(char *)param_00);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}